

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_mainwindow.h
# Opt level: O1

void __thiscall Ui_MainWindow::setupUi(Ui_MainWindow *this,QMainWindow *MainWindow)

{
  QWidget *pQVar1;
  QGridLayout *pQVar2;
  QMarkdownTextEdit *this_00;
  QMenuBar *this_01;
  QToolBar *this_02;
  QStatusBar *this_03;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QArrayData *local_38;
  undefined8 uStack_30;
  long local_28;
  
  QObject::objectName();
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  if (local_28 == 0) {
    QVar10.m_data = (storage_type *)0xa;
    QVar10.m_size = (qsizetype)&local_38;
    QString::fromUtf8(QVar10);
    QObject::setObjectName((QString *)MainWindow);
    if (local_38 != (QArrayData *)0x0) {
      LOCK();
      (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_38,2,8);
      }
    }
  }
  local_38 = (QArrayData *)&DAT_3470000042e;
  QWidget::resize((QSize *)MainWindow);
  QVar3.m_data = (storage_type *)0x11;
  QVar3.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar3);
  QWidget::setWindowTitle((QString *)MainWindow);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  pQVar1 = (QWidget *)operator_new(0x28);
  QWidget::QWidget(pQVar1,MainWindow,0);
  this->centralWidget = pQVar1;
  QVar4.m_data = (storage_type *)0xd;
  QVar4.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar4);
  QObject::setObjectName((QString *)pQVar1);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  pQVar2 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(pQVar2,this->centralWidget);
  this->gridLayout = pQVar2;
  (**(code **)(*(long *)pQVar2 + 0x68))(pQVar2,6);
  QLayout::setContentsMargins((int)this->gridLayout,0xb,0xb,0xb);
  pQVar2 = this->gridLayout;
  QVar5.m_data = (storage_type *)0xa;
  QVar5.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar5);
  QObject::setObjectName((QString *)pQVar2);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  this_00 = (QMarkdownTextEdit *)operator_new(0x98);
  QMarkdownTextEdit::QMarkdownTextEdit(this_00,this->centralWidget,true);
  this->textEdit = this_00;
  QVar6.m_data = (storage_type *)0x8;
  QVar6.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar6);
  QObject::setObjectName((QString *)this_00);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  QGridLayout::addWidget(this->gridLayout,this->textEdit,0,0,1,1,0);
  QMainWindow::setCentralWidget((QWidget *)MainWindow);
  this_01 = (QMenuBar *)operator_new(0x28);
  QMenuBar::QMenuBar(this_01,(QWidget *)MainWindow);
  this->menuBar = this_01;
  QVar7.m_data = (storage_type *)0x7;
  QVar7.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar7);
  QObject::setObjectName((QString *)this_01);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  local_38 = (QArrayData *)0x0;
  uStack_30 = 0x160000042d;
  QWidget::setGeometry((QRect *)this->menuBar);
  QMainWindow::setMenuBar((QMenuBar *)MainWindow);
  this_02 = (QToolBar *)operator_new(0x28);
  QToolBar::QToolBar(this_02,(QWidget *)MainWindow);
  this->mainToolBar = this_02;
  QVar8.m_data = (storage_type *)0xb;
  QVar8.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar8);
  QObject::setObjectName((QString *)this_02);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  QMainWindow::addToolBar((ToolBarArea)MainWindow,(QToolBar *)0x4);
  this_03 = (QStatusBar *)operator_new(0x28);
  QStatusBar::QStatusBar(this_03,(QWidget *)MainWindow);
  this->statusBar = this_03;
  QVar9.m_data = (storage_type *)0x9;
  QVar9.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar9);
  QObject::setObjectName((QString *)this_03);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,8);
    }
  }
  QMainWindow::setStatusBar((QStatusBar *)MainWindow);
  retranslateUi(this,MainWindow);
  QMetaObject::connectSlotsByName((QObject *)MainWindow);
  return;
}

Assistant:

void setupUi(QMainWindow *MainWindow)
    {
        if (MainWindow->objectName().isEmpty())
            MainWindow->setObjectName(QString::fromUtf8("MainWindow"));
        MainWindow->resize(1070, 839);
        MainWindow->setWindowTitle(QString::fromUtf8("QMarkdownTextEdit"));
        centralWidget = new QWidget(MainWindow);
        centralWidget->setObjectName(QString::fromUtf8("centralWidget"));
        gridLayout = new QGridLayout(centralWidget);
        gridLayout->setSpacing(6);
        gridLayout->setContentsMargins(11, 11, 11, 11);
        gridLayout->setObjectName(QString::fromUtf8("gridLayout"));
        textEdit = new QMarkdownTextEdit(centralWidget);
        textEdit->setObjectName(QString::fromUtf8("textEdit"));

        gridLayout->addWidget(textEdit, 0, 0, 1, 1);

        MainWindow->setCentralWidget(centralWidget);
        menuBar = new QMenuBar(MainWindow);
        menuBar->setObjectName(QString::fromUtf8("menuBar"));
        menuBar->setGeometry(QRect(0, 0, 1070, 23));
        MainWindow->setMenuBar(menuBar);
        mainToolBar = new QToolBar(MainWindow);
        mainToolBar->setObjectName(QString::fromUtf8("mainToolBar"));
        MainWindow->addToolBar(Qt::TopToolBarArea, mainToolBar);
        statusBar = new QStatusBar(MainWindow);
        statusBar->setObjectName(QString::fromUtf8("statusBar"));
        MainWindow->setStatusBar(statusBar);

        retranslateUi(MainWindow);

        QMetaObject::connectSlotsByName(MainWindow);
    }